

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O1

bool __thiscall
Diligent::DearchiverBase::LoadArchive
          (DearchiverBase *this,IDataBlob *pArchiveData,Uint32 ContentVersion,bool MakeCopy)

{
  pointer pAVar1;
  RefCntAutoPtr<Diligent::IDataBlob> RVar2;
  _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  undefined1 uVar3;
  undefined4 uVar4;
  pointer pAVar5;
  DeviceObjectArchive *this_01;
  const_iterator cVar6;
  pointer *__ptr;
  char (*in_R8) [33];
  _Hash_node_base *p_Var7;
  bool bVar8;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_unsigned_long>,_false,_false>,_bool>
  pVar9;
  unique_ptr<Diligent::DeviceObjectArchive,_std::default_delete<Diligent::DeviceObjectArchive>_>
  pObjArchive;
  string _msg;
  char *ResName;
  size_t ArchiveIdx;
  _Head_base<0UL,_Diligent::DeviceObjectArchive_*,_false> local_78;
  undefined1 local_70 [12];
  bool bStack_64;
  undefined3 uStack_63;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_60;
  undefined4 local_4c;
  vector<Diligent::DearchiverBase::ArchiveData,std::allocator<Diligent::DearchiverBase::ArchiveData>>
  *local_48;
  _Hash_node_base *local_40;
  long local_38;
  undefined7 extraout_var;
  
  if (pArchiveData == (IDataBlob *)0x0) {
    uVar3 = 0;
  }
  else {
    pAVar5 = (this->m_Archives).
             super__Vector_base<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pAVar1 = (this->m_Archives).
             super__Vector_base<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar8 = pAVar5 == pAVar1;
    if (!bVar8) {
      RVar2.m_pObject =
           (((pAVar5->pObjArchive)._M_t.
             super___uniq_ptr_impl<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_Diligent::DeviceObjectArchive_*,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
             .super__Head_base<0UL,_const_Diligent::DeviceObjectArchive_*,_false>._M_head_impl)->
           m_pArchiveData).m_pObject;
      while (RVar2.m_pObject != pArchiveData) {
        pAVar5 = pAVar5 + 1;
        bVar8 = pAVar5 == pAVar1;
        if (bVar8) goto LAB_0046e763;
        RVar2.m_pObject =
             (((pAVar5->pObjArchive)._M_t.
               super___uniq_ptr_impl<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_Diligent::DeviceObjectArchive_*,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
               .super__Head_base<0UL,_const_Diligent::DeviceObjectArchive_*,_false>._M_head_impl)->
             m_pArchiveData).m_pObject;
      }
      if (!bVar8) {
        return (bool)1;
      }
    }
LAB_0046e763:
    this_01 = (DeviceObjectArchive *)operator_new(0xf0);
    DeviceObjectArchive::DeviceObjectArchive(this_01,0);
    stack0xffffffffffffff98 = CONCAT14(MakeCopy,ContentVersion);
    local_78._M_head_impl = this_01;
    local_70._0_8_ = pArchiveData;
    bVar8 = DeviceObjectArchive::Deserialize(this_01,(CreateInfo *)local_70);
    uVar4 = (undefined4)CONCAT71(extraout_var,bVar8);
    if (bVar8) {
      local_48 = (vector<Diligent::DearchiverBase::ArchiveData,std::allocator<Diligent::DearchiverBase::ArchiveData>>
                  *)&this->m_Archives;
      local_38 = ((long)(this->m_Archives).
                        super__Vector_base<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_Archives).
                        super__Vector_base<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7dc11f7047dc11f7;
      p_Var7 = ((local_78._M_head_impl)->m_NamedResources)._M_h._M_before_begin._M_nxt;
      local_4c = uVar4;
      if (p_Var7 != (_Hash_node_base *)0x0) {
        do {
          uVar4 = *(undefined4 *)&p_Var7[1]._M_nxt;
          local_40 = p_Var7[2]._M_nxt;
          local_70._0_4_ = uVar4;
          HashMapStringKey::HashMapStringKey
                    ((HashMapStringKey *)(local_70 + 8),(Char *)local_40,true);
          pVar9 = std::
                  _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,unsigned_long>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  ::_M_emplace<Diligent::DeviceObjectArchive::NamedResourceKey,unsigned_long_const&>
                            ((_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,unsigned_long>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                              *)&this->m_ResNameToArchiveIdx,local_70,&local_38);
          if ((stack0xffffffffffffff98 != (Char *)0x0) &&
             ((long)aStack_60._M_allocated_capacity < 0)) {
            operator_delete__(stack0xffffffffffffff98);
          }
          stack0xffffffffffffff98 = (Char *)0x0;
          aStack_60._M_allocated_capacity = 0;
          if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            this_00 = *(_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        **)(*(long *)local_48 +
                           *(long *)((long)pVar9.first.
                                           super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_unsigned_long>,_false>
                                           ._M_cur.
                                           super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_unsigned_long>,_false>
                                    + 0x20) * 0x1c8);
            HashMapStringKey::HashMapStringKey
                      ((HashMapStringKey *)(local_70 + 8),(Char *)local_40,false);
            cVar6 = std::
                    _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(this_00,(key_type *)local_70);
            if ((stack0xffffffffffffff98 != (Char *)0x0) &&
               ((long)aStack_60._M_allocated_capacity < 0)) {
              operator_delete__(stack0xffffffffffffff98);
            }
            stack0xffffffffffffff98 = (Char *)0x0;
            aStack_60._M_allocated_capacity = 0;
            if ((cVar6.
                 super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                 ._M_cur == (__node_type *)0x0) ||
               (bVar8 = DeviceObjectArchive::ResourceData::operator==
                                  ((ResourceData *)(p_Var7 + 4),
                                   (ResourceData *)
                                   ((long)cVar6.
                                          super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                                          ._M_cur + 0x20)), !bVar8)) {
              FormatString<char[21],char_const*,char[33]>
                        ((string *)local_70,(Diligent *)"Resource with name \'",
                         (char (*) [21])&local_40,(char **)"\' already exists in the archive.",in_R8
                        );
              if (DebugMessageCallback != (undefined *)0x0) {
                in_R8 = (char (*) [33])0x0;
                (*(code *)DebugMessageCallback)(2,local_70._0_8_,0,0);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._0_8_ != &aStack_60) {
                operator_delete((void *)local_70._0_8_,aStack_60._M_allocated_capacity + 1);
              }
            }
          }
          p_Var7 = p_Var7->_M_nxt;
        } while (p_Var7 != (_Hash_node_base *)0x0);
      }
      std::
      vector<Diligent::DearchiverBase::ArchiveData,std::allocator<Diligent::DearchiverBase::ArchiveData>>
      ::
      emplace_back<std::unique_ptr<Diligent::DeviceObjectArchive,std::default_delete<Diligent::DeviceObjectArchive>>>
                (local_48,(unique_ptr<Diligent::DeviceObjectArchive,_std::default_delete<Diligent::DeviceObjectArchive>_>
                           *)&local_78);
      uVar4 = local_4c;
    }
    if (local_78._M_head_impl != (DeviceObjectArchive *)0x0) {
      std::default_delete<Diligent::DeviceObjectArchive>::operator()
                ((default_delete<Diligent::DeviceObjectArchive> *)&local_78,local_78._M_head_impl);
    }
    uVar3 = (undefined1)uVar4;
  }
  return (bool)uVar3;
}

Assistant:

bool DearchiverBase::LoadArchive(const IDataBlob* pArchiveData, Uint32 ContentVersion, bool MakeCopy)
{
    if (pArchiveData == nullptr)
        return false;

    for (const ArchiveData& Archive : m_Archives)
    {
        if (Archive.pObjArchive->GetData() == pArchiveData)
        {
            // The archive is already loaded
            return true;
        }
    }

    std::unique_ptr<DeviceObjectArchive> pObjArchive = std::make_unique<DeviceObjectArchive>();
    if (!pObjArchive->Deserialize(DeviceObjectArchive::CreateInfo{pArchiveData, ContentVersion, MakeCopy}))
        return false;

    const size_t ArchiveIdx = m_Archives.size();

    const auto& ArchiveResources = pObjArchive->GetNamedResources();
    for (const auto& it : ArchiveResources)
    {
        const ResourceType ResType      = it.first.GetType();
        const char*        ResName      = it.first.GetName();
        constexpr bool     MakeNameCopy = true;

        const auto it_inserted = m_ResNameToArchiveIdx.emplace(NamedResourceKey{ResType, ResName, MakeNameCopy}, ArchiveIdx);
        if (!it_inserted.second)
        {
            const auto& OtherArchiveResources = m_Archives[it_inserted.first->second].pObjArchive->GetNamedResources();
            const auto  it_other              = OtherArchiveResources.find(NamedResourceKey{ResType, ResName});

            const bool IsDuplicate =
                (it_other != OtherArchiveResources.end()) &&
                (it.second == it_other->second);
            if (!IsDuplicate)
            {
                LOG_ERROR_MESSAGE("Resource with name '", ResName, "' already exists in the archive.");
            }
        }
    }

    m_Archives.emplace_back(std::move(pObjArchive));

    return true;
}